

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype QtPrivate::findString
                    (QStringView haystack,qsizetype from,QLatin1StringView needle,CaseSensitivity cs
                    )

{
  QStringView needle0;
  qsizetype qVar1;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> s;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = -1;
  if (needle.m_size <= haystack.m_size) {
    memset(&local_250,0xaa,0x218);
    qt_from_latin1_to_qvla(&local_250,needle);
    needle0.m_data =
         (storage_type_conflict *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
    needle0.m_size = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
    qVar1 = findString(haystack,from,needle0,cs);
    if ((QVLAStorage<2UL,_2UL,_256LL> *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr !=
        &local_250.super_QVLAStorage<2UL,_2UL,_256LL>) {
      sizedFree(local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,
                local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::findString(QStringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    if (haystack.size() < needle.size())
        return -1;

    QVarLengthArray<char16_t> s = qt_from_latin1_to_qvla(needle);
    return QtPrivate::findString(haystack, from, QStringView(reinterpret_cast<const QChar*>(s.constData()), s.size()), cs);
}